

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O1

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  uint *puVar1;
  type *ptVar2;
  AlignmentType AVar3;
  pointer ppNVar4;
  Implementation *pIVar5;
  Node *pNVar6;
  __mxxxi *palVar7;
  __mxxxi *palVar8;
  pointer ppEVar9;
  __mxxxi alVar10;
  __mxxxi alVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  Graph *pGVar15;
  int32_t iVar16;
  ulong uVar17;
  long lVar18;
  undefined4 extraout_var;
  pointer ppVar19;
  uint uVar20;
  pointer ppNVar21;
  pointer ppEVar22;
  pointer ppVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  __mxxxi *palVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  uint32_t i;
  long lVar33;
  pointer ppEVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  __mxxxi *palVar38;
  ulong uVar39;
  pointer pSVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  __mxxxi alVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar47 [32];
  __mxxxi alVar48;
  undefined1 auVar49 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  backtrack_storage;
  type unpacked [8];
  bool local_149;
  uint local_148;
  uint local_144;
  long local_140;
  uint local_134;
  ulong local_130;
  type *local_128;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_120;
  uint local_114;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  type *local_f0;
  pointer local_e8;
  ulong local_e0;
  Graph *local_d8;
  long local_d0;
  uint local_c4;
  __mxxxi local_c0;
  pointer local_98;
  pointer local_90;
  ulong local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar42 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar42._0_8_ * 0.125;
  auVar42 = vroundsd_avx(auVar46,auVar46,10);
  local_140 = vcvttsd2usi_avx512f(auVar42);
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  uVar17 = 0;
  uVar20 = 0;
  do {
    *(undefined4 *)((long)&local_80 + uVar17 * 4) = 0x80000400;
    if (((uint)uVar17 + 1 & (uint)uVar17 & 0xfffffffe) == 0) {
      uVar39 = (ulong)uVar20;
      uVar20 = uVar20 + 1;
      palVar28 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar39;
      (*palVar28)[0] = local_80;
      (*palVar28)[1] = lStack_78;
      (*palVar28)[2] = lStack_70;
      (*palVar28)[3] = lStack_68;
    }
  } while ((uVar17 < 7) && (uVar17 = uVar17 + 1, uVar20 < 3));
  palVar28 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar28[3][0] = -0x7ffffc0000000000;
  palVar28[3][1] = -0x7ffffbff7ffffc00;
  palVar28[3][2] = -0x7ffffbff7ffffc00;
  palVar28[3][3] = -0x7ffffbff7ffffc00;
  alVar43 = (__mxxxi)vpbroadcastd_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar43;
  lVar18 = 0;
  do {
    palVar28 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar44 = *(undefined1 (*) [32])((long)*palVar28 + lVar18);
    auVar44 = vpaddd_avx2(auVar44,auVar44);
    *(undefined1 (*) [32])((long)palVar28[1] + lVar18) = auVar44;
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0x40);
  iVar26 = -0x7ffffc00;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    iVar26 = 0;
  }
  uVar20 = sequence_len - 1;
  ppNVar21 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppNVar4 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_f0 = (type *)CONCAT44(local_f0._4_4_,uVar20);
  if (ppNVar21 == ppNVar4) {
    uVar17 = 0xffffffff;
  }
  else {
    local_e8 = (pointer)CONCAT44(local_e8._4_4_,(int)(this->super_AlignmentEngine).g_);
    auVar44 = vpbroadcastd_avx512vl();
    local_130 = (ulong)(uVar20 & 7);
    uVar17 = 0xffffffff;
    alVar43[1]._0_4_ = 0x80000400;
    alVar43[0] = 0x8000040080000400;
    alVar43[1]._4_4_ = 0x80000400;
    alVar43[2]._0_4_ = 0x80000400;
    alVar43[2]._4_4_ = 0x80000400;
    alVar43[3]._0_4_ = 0x80000400;
    alVar43[3]._4_4_ = 0x80000400;
    do {
      pIVar5 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pNVar6 = *ppNVar21;
      lVar18 = *(long *)&(pIVar5->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
      ppEVar34 = (pNVar6->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppEVar34 ==
          (pNVar6->inedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar39 = 0;
      }
      else {
        uVar39 = (ulong)(*(int *)(lVar18 + (ulong)(*ppEVar34)->tail->id * 4) + 1);
      }
      lVar27 = (ulong)pNVar6->code * local_140;
      palVar28 = pIVar5->sequence_profile;
      uVar36 = *(int *)(lVar18 + (ulong)pNVar6->id * 4) + 1;
      palVar7 = pIVar5->H;
      palVar38 = palVar7 + (ulong)uVar36 * local_140;
      if (local_140 != 0) {
        lVar31 = uVar39 * local_140;
        auVar49 = ZEXT464(*(uint *)(*(long *)&(pIVar5->first_column).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   + uVar39 * 4));
        lVar33 = 0;
        lVar18 = local_140;
        do {
          auVar45 = *(undefined1 (*) [32])((long)palVar7[lVar31] + lVar33);
          auVar47 = vperm2i128_avx2(auVar45,auVar45,0x28);
          auVar45 = vpalignr_avx2(auVar45,auVar47,0xc);
          auVar45 = vpor_avx2(auVar45,auVar49._0_32_);
          auVar47 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                           ((long)palVar7[lVar31] + lVar33 + 0x10)),0xc);
          auVar49 = ZEXT3264(auVar47);
          *(undefined1 (*) [32])((long)*palVar38 + lVar33) = auVar45;
          auVar45 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])((long)palVar28[lVar27] + lVar33));
          auVar47 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])((long)palVar7[lVar31] + lVar33));
          auVar45 = vpmaxsd_avx2(auVar45,auVar47);
          *(undefined1 (*) [32])((long)*palVar38 + lVar33) = auVar45;
          lVar33 = lVar33 + 0x20;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      ppEVar34 = ((*ppNVar21)->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (8 < (ulong)((long)((*ppNVar21)->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar34)) {
        uVar39 = 1;
        do {
          if (local_140 != 0) {
            pIVar5 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     .
                     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl;
            uVar24 = (ulong)(*(int *)(*(long *)&(pIVar5->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar34[uVar39]->tail->id * 4) + 1);
            auVar49 = ZEXT464(*(uint *)(*(long *)&(pIVar5->first_column).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar24 * 4));
            lVar31 = uVar24 * local_140;
            palVar7 = pIVar5->H;
            lVar33 = 0;
            lVar18 = local_140;
            do {
              auVar45 = *(undefined1 (*) [32])((long)palVar7[lVar31] + lVar33);
              auVar47 = vperm2i128_avx2(auVar45,auVar45,0x28);
              auVar45 = vpalignr_avx2(auVar45,auVar47,0xc);
              auVar45 = vpor_avx2(auVar45,auVar49._0_32_);
              auVar47 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                               ((long)palVar7[lVar31] + lVar33 + 0x10)),0xc);
              auVar49 = ZEXT3264(auVar47);
              auVar45 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])((long)palVar28[lVar27] + lVar33))
              ;
              auVar47 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])((long)palVar7[lVar31] + lVar33));
              auVar45 = vpmaxsd_avx2(auVar45,auVar47);
              auVar45 = vpmaxsd_avx2(auVar45,*(undefined1 (*) [32])((long)*palVar38 + lVar33));
              *(undefined1 (*) [32])((long)*palVar38 + lVar33) = auVar45;
              lVar33 = lVar33 + 0x20;
              lVar18 = lVar18 + -1;
            } while (lVar18 != 0);
          }
          uVar39 = (ulong)((int)uVar39 + 1);
          ppEVar34 = ((*ppNVar21)->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        } while (uVar39 < (ulong)((long)((*ppNVar21)->inedges).
                                        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar34
                                 >> 3));
      }
      alVar48 = alVar43;
      if (local_140 != 0) {
        auVar42 = vpbroadcastd_avx512vl();
        auVar49 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),auVar42._0_4_));
        palVar28 = palVar38;
        lVar18 = local_140;
        do {
          auVar45 = vorps_avx(auVar49._0_32_,
                              (undefined1  [32])
                              ((this->pimpl_)._M_t.
                               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                               .
                               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                              ._M_head_impl)->masks[3]);
          alVar10 = (__mxxxi)vpmaxsd_avx2(auVar45,(undefined1  [32])*palVar28);
          *palVar28 = alVar10;
          pIVar5 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          palVar7 = pIVar5->masks;
          palVar8 = pIVar5->penalties;
          auVar45 = vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])*palVar8);
          auVar47 = vperm2i128_avx2(auVar45,auVar45,0x28);
          auVar45 = vpalignr_avx2(auVar45,auVar47,0xc);
          auVar45 = vpor_avx2(auVar45,(undefined1  [32])*palVar7);
          alVar10 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar10,auVar45);
          *palVar28 = alVar10;
          auVar45 = vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])palVar8[1]);
          auVar45 = valignq_avx512vl(auVar45,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
          auVar45 = vpor_avx2(auVar45,(undefined1  [32])palVar7[1]);
          alVar10 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar10,auVar45);
          *palVar28 = alVar10;
          auVar45 = vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])palVar8[2]);
          auVar45 = vperm2i128_avx2(auVar45,auVar45,0x28);
          auVar45 = vpor_avx2(auVar45,(undefined1  [32])palVar7[2]);
          alVar10 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar10,auVar45);
          *palVar28 = alVar10;
          if ((this->super_AlignmentEngine).type_ == kSW) {
            alVar11 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar10,
                                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            *palVar28 = alVar11;
          }
          auVar42 = vpaddd_avx(alVar10._16_16_,auVar44._16_16_);
          auVar45 = vpsrldq_avx2(ZEXT1632(auVar42),0xc);
          auVar49 = ZEXT3264(auVar45);
          alVar48 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar48,(undefined1  [32])*palVar28);
          palVar28 = palVar28 + 1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      AVar3 = (this->super_AlignmentEngine).type_;
      if (AVar3 == kSW) {
        local_c0[0] = alVar48[0];
        local_c0[1] = alVar48[1];
        local_c0[2] = alVar48[2];
        local_c0[3] = alVar48[3];
        lVar18 = 0;
        iVar30 = 0;
        do {
          iVar29 = *(int *)((long)local_c0 + lVar18 * 4);
          if (iVar29 < iVar30) {
            iVar29 = iVar30;
          }
          lVar18 = lVar18 + 1;
          iVar30 = iVar29;
        } while (lVar18 != 8);
LAB_001187d5:
        if (iVar26 < iVar29) {
          uVar17 = (ulong)uVar36;
        }
        if (iVar26 <= iVar29) {
          iVar26 = iVar29;
        }
      }
      else if (AVar3 == kNW) {
        if (((*ppNVar21)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ((*ppNVar21)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_c0 = palVar38[local_140 + -1];
          iVar29 = *(int *)((long)local_c0 + local_130 * 4);
          goto LAB_001187d5;
        }
      }
      else if ((AVar3 == kOV) &&
              (((*ppNVar21)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start ==
               ((*ppNVar21)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish)) {
        local_c0[0] = alVar48[0];
        local_c0[1] = alVar48[1];
        local_c0[2] = alVar48[2];
        local_c0[3] = alVar48[3];
        lVar18 = 0;
        iVar29 = 0;
        do {
          iVar30 = *(int *)((long)local_c0 + lVar18 * 4);
          if (iVar30 < iVar29) {
            iVar30 = iVar29;
          }
          iVar29 = iVar30;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 8);
        goto LAB_001187d5;
      }
      ppNVar21 = ppNVar21 + 1;
    } while (ppNVar21 != ppNVar4);
  }
  iVar30 = (int)uVar17;
  if (iVar30 == -1) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = iVar26;
  }
  AVar3 = (this->super_AlignmentEngine).type_;
  local_128 = score;
  local_120 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              __return_storage_ptr__;
  local_d8 = graph;
  if (AVar3 != kSW) {
    if (AVar3 == kNW) {
      uVar39 = (ulong)uVar20;
      goto LAB_00118882;
    }
    uVar39 = 0xffffffff;
    if ((AVar3 != kOV) ||
       (pNVar6 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)iVar30 + -1], uVar39 = (ulong)uVar20
       , (pNVar6->outedges).
         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         *(pointer *)
          ((long)&(pNVar6->outedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl + 8))) goto LAB_00118882;
  }
  iVar16 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                     (((this->pimpl_)._M_t.
                       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       .
                       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl)->H + iVar30 * local_140,(uint32_t)local_140,iVar26);
  uVar39 = CONCAT44(extraout_var,iVar16);
LAB_00118882:
  if (iVar30 == 0) {
    uVar20 = 1;
  }
  else {
    uVar20 = 1;
    uVar24 = 0;
    do {
      pNVar6 = (graph->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar24];
      uVar36 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&(pNVar6->inedges).
                                             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                             ._M_impl + 8) -
                             *(long *)&(pNVar6->inedges).
                                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                       ._M_impl.super__Vector_impl_data) >> 3);
      if (uVar36 < uVar20) {
        uVar36 = uVar20;
      }
      uVar20 = uVar36;
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  local_130 = uVar39;
  std::
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
            *)local_c0,(ulong)(uVar20 * 0x10 + 0x18),(allocator_type *)&local_110);
  local_e8 = (pointer)(local_c0[0] + 0x20);
  local_f0 = ((pointer)(local_c0[0] + 0x20))->arr + (uVar20 << 3);
  local_128 = local_f0 + (uVar20 << 3);
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_148 = (uint)local_130;
  local_114 = (uint)(local_130 >> 3) & 0x1fffffff;
  local_130 = (ulong)(local_148 & 7);
  local_e0 = 0;
  *(pointer *)(local_120 + 0x10) = (pointer)0x0;
  *(undefined1 (*) [16])local_120 = (undefined1  [16])0x0;
  local_149 = true;
  local_134 = 0;
  local_98 = (pointer)local_c0[0];
  pSVar40 = (pointer)local_c0[0];
  do {
    iVar26 = (int)uVar17;
    if ((local_148 == 0xffffffff) || (iVar26 == 0)) {
      uVar39 = uVar17 & 0xffffffff;
      break;
    }
    local_d0 = (long)(iVar26 + -1);
    if (local_149) {
      if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_90 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      uVar39 = (ulong)local_114;
      palVar28 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->H + iVar26 * local_140 + uVar39;
      lVar12 = (*palVar28)[1];
      lVar13 = (*palVar28)[2];
      lVar14 = (*palVar28)[3];
      *(longlong *)pSVar40->arr = (*palVar28)[0];
      *(longlong *)(pSVar40->arr + 2) = lVar12;
      *(longlong *)(pSVar40->arr + 4) = lVar13;
      *(longlong *)(pSVar40->arr + 6) = lVar14;
      ppEVar34 = (local_90[local_d0]->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar9 = *(pointer *)
                 ((long)&(local_90[local_d0]->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      local_88 = uVar17;
      if (ppEVar34 == ppEVar9) {
        local_144 = 0;
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                    (&local_110,
                     (iterator)
                     local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(int *)&local_144);
        }
        else {
          *local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        palVar28 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H + uVar39;
        lVar12 = (*palVar28)[1];
        lVar13 = (*palVar28)[2];
        lVar14 = (*palVar28)[3];
        *(longlong *)local_e8->arr = (*palVar28)[0];
        *(longlong *)(local_e8->arr + 2) = lVar12;
        *(longlong *)(local_e8->arr + 4) = lVar13;
        *(longlong *)(local_e8->arr + 6) = lVar14;
      }
      else {
        uVar17 = 0;
        do {
          local_144 = *(int *)(*(long *)&(((this->pimpl_)._M_t.
                                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           .
                                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                                          ._M_head_impl)->node_id_to_rank).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              + (ulong)*(uint *)**(undefined8 **)((long)ppEVar34 + uVar17) * 4) + 1;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_110,
                       (iterator)
                       local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_144);
          }
          else {
            *local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_144;
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          palVar28 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H +
                     (ulong)local_110.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish[-1] * local_140 + uVar39;
          lVar12 = (*palVar28)[1];
          lVar13 = (*palVar28)[2];
          lVar14 = (*palVar28)[3];
          ptVar2 = local_e8->arr + (uVar17 & 0xffffffff);
          *(longlong *)ptVar2 = (*palVar28)[0];
          *(longlong *)(ptVar2 + 2) = lVar12;
          *(longlong *)(ptVar2 + 4) = lVar13;
          *(longlong *)(ptVar2 + 6) = lVar14;
          lVar18 = uVar17 + 8;
          uVar17 = uVar17 + 8;
        } while ((pointer)((long)ppEVar34 + lVar18) != ppEVar9);
      }
      palVar28 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->sequence_profile +
                 (ulong)local_90[local_d0]->code * local_140 + uVar39;
      lVar12 = (*palVar28)[1];
      lVar13 = (*palVar28)[2];
      lVar14 = (*palVar28)[3];
      *(longlong *)(local_128 + 8) = (*palVar28)[0];
      *(longlong *)(local_128 + 10) = lVar12;
      *(longlong *)(local_128 + 0xc) = lVar13;
      *(longlong *)(local_128 + 0xe) = lVar14;
      uVar17 = local_88;
      graph = local_d8;
      pSVar40 = local_98;
    }
    pGVar15 = local_d8;
    uVar20 = (uint)local_130;
    uVar24 = local_130 & 0xffffffff;
    iVar26 = (int)uVar17;
    if (((this->super_AlignmentEngine).type_ == kSW) && (pSVar40->arr[uVar24] == 0)) {
      bVar41 = false;
      uVar39 = uVar17 & 0xffffffff;
    }
    else {
      if (uVar20 == 0) {
        pIVar5 = (this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 .
                 super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl;
        if (local_114 == 0) {
          lVar18 = *(long *)&(pIVar5->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          local_128[7] = *(type *)(lVar18 + (long)iVar26 * 4);
          if ((long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            uVar39 = 7;
            uVar25 = 0;
            do {
              puVar1 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar25;
              uVar25 = uVar25 + 1;
              local_f0[uVar39] = *(type *)(lVar18 + (ulong)*puVar1 * 4);
              uVar39 = (ulong)((int)uVar39 + 8);
            } while ((uVar25 & 0xffffffff) <
                     (ulong)((long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
          }
        }
        else {
          palVar28 = pIVar5->H + iVar26 * local_140 + ((ulong)local_114 - 1);
          lVar12 = *(longlong *)((long)*palVar28 + 8);
          lVar13 = *(longlong *)((long)*palVar28 + 0x10);
          lVar14 = *(longlong *)((long)*palVar28 + 0x18);
          *(longlong *)local_128 = (*palVar28)[0];
          *(longlong *)(local_128 + 2) = lVar12;
          *(longlong *)(local_128 + 4) = lVar13;
          *(longlong *)(local_128 + 6) = lVar14;
          if ((long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            uVar39 = 0;
            uVar25 = 0;
            do {
              palVar28 = ((this->pimpl_)._M_t.
                          super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          .
                          super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                         ._M_head_impl)->H +
                         (ulong)local_110.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar25] * local_140 +
                         ((ulong)local_114 - 1);
              lVar12 = *(longlong *)((long)*palVar28 + 8);
              lVar13 = *(longlong *)((long)*palVar28 + 0x10);
              lVar14 = *(longlong *)((long)*palVar28 + 0x18);
              ptVar2 = local_f0 + uVar39;
              *(longlong *)ptVar2 = (*palVar28)[0];
              *(longlong *)(ptVar2 + 2) = lVar12;
              *(longlong *)(ptVar2 + 4) = lVar13;
              *(longlong *)(ptVar2 + 6) = lVar14;
              uVar25 = uVar25 + 1;
              uVar39 = (ulong)((int)uVar39 + 8);
            } while ((uVar25 & 0xffffffff) <
                     (ulong)((long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
          }
        }
      }
      uVar25 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar36 = uVar20 - 1;
        uVar35 = 7;
        uVar39 = 1;
        uVar37 = 0;
        do {
          uVar32 = uVar39;
          if (uVar20 == 0) {
            if (pSVar40->arr[0] == local_128[8] + local_f0[uVar35]) {
LAB_00118c67:
              local_e0 = (ulong)local_110.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar37];
              local_134 = local_148 - 1;
              bVar41 = true;
              goto LAB_00118c80;
            }
          }
          else if (pSVar40->arr[uVar24] == local_128[uVar24 + 8] + pSVar40[1].arr[uVar36])
          goto LAB_00118c67;
          uVar36 = uVar36 + 8;
          uVar35 = (ulong)((int)uVar35 + 8);
          uVar39 = (ulong)((int)uVar32 + 1);
          uVar37 = uVar32;
        } while (uVar32 < uVar25);
      }
      bVar41 = false;
LAB_00118c80:
      uVar39 = local_e0;
      if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start && !bVar41) {
        iVar30 = (int)(this->super_AlignmentEngine).g_;
        if (pSVar40->arr[uVar24] == pSVar40[1].arr[uVar24] + iVar30) {
          uVar35 = 0;
        }
        else {
          uVar37 = 1;
          uVar36 = uVar20;
          do {
            uVar35 = uVar37;
            uVar36 = uVar36 + 8;
            if (uVar25 <= uVar35) goto LAB_00118d6d;
            uVar37 = (ulong)((int)uVar35 + 1);
          } while (pSVar40->arr[uVar24] != local_e8->arr[uVar36] + iVar30);
        }
        bVar41 = true;
        local_134 = local_148;
        uVar39 = (ulong)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar35];
      }
LAB_00118d6d:
      if (!bVar41) {
        if (uVar20 == 0) {
          if (pSVar40->arr[0] == (int)(this->super_AlignmentEngine).g_ + local_128[7])
          goto LAB_00118da1;
        }
        else if (pSVar40->arr[uVar24] ==
                 (int)(this->super_AlignmentEngine).g_ + pSVar40->arr[uVar24 - 1]) {
LAB_00118da1:
          local_134 = local_148 - 1;
          uVar39 = uVar17 & 0xffffffff;
        }
      }
      local_144 = 0xffffffff;
      if (iVar26 != (int)uVar39) {
        local_144 = (local_d8->rank_to_node_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_d0]->id;
      }
      local_c4 = local_148;
      if (local_148 == local_134) {
        local_c4 = 0xffffffff;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int,int>(local_120,&local_144,(int *)&local_c4);
      bVar41 = true;
      local_149 = true;
      if (iVar26 == (int)uVar39) {
        local_149 = (~local_134 & 7) == 0 && local_148 != local_134;
      }
      local_148 = local_134;
      local_114 = local_134 >> 3;
      local_130 = (ulong)(local_134 & 7);
      local_e0 = uVar39 & 0xffffffff;
      uVar17 = uVar39 & 0xffffffff;
      graph = pGVar15;
    }
  } while (bVar41);
  if ((this->super_AlignmentEngine).type_ == kNW) {
    if (((int)uVar39 == 0) && (local_148 != 0xffffffff)) {
      do {
        local_144 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_120,(int *)&local_144,(int *)&local_148);
        bVar41 = local_148 != 0;
        local_148 = local_148 - 1;
      } while (bVar41);
    }
    if (((int)uVar39 != 0) && (local_148 == 0xffffffff)) {
      do {
        iVar26 = (int)uVar39;
        local_144 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int>
                  (local_120,
                   &(graph->rank_to_node_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)iVar26 + -1]->id,
                   (int *)&local_144);
        pNVar6 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)iVar26 + -1];
        ppEVar34 = (pNVar6->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar9 = *(pointer *)
                   ((long)&(pNVar6->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl + 8);
        if (ppEVar34 == ppEVar9) {
          uVar39 = 0;
        }
        else {
          pIVar5 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          lVar18 = *(long *)&(pIVar5->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          uVar17 = uVar39 & 0xffffffff;
          do {
            ppEVar22 = ppEVar34 + 1;
            uVar39 = (ulong)(*(int *)(*(long *)&(pIVar5->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)(*ppEVar34)->tail->id * 4) + 1);
            if (*(int *)(lVar18 + (long)iVar26 * 4) ==
                *(int *)(lVar18 + uVar39 * 4) + (int)(this->super_AlignmentEngine).g_) break;
            uVar39 = uVar17;
            ppEVar34 = ppEVar22;
          } while (ppEVar22 != ppEVar9);
        }
      } while (((int)uVar39 != 0) && (local_148 == 0xffffffff));
    }
  }
  ppVar19 = *(pointer *)local_120;
  ppVar23 = *(pointer *)(local_120 + 8) + -1;
  if (ppVar19 < ppVar23 && ppVar19 != *(pointer *)(local_120 + 8)) {
    do {
      iVar26 = ppVar19->first;
      ppVar19->first = ppVar23->first;
      ppVar23->first = iVar26;
      iVar26 = ppVar19->second;
      ppVar19->second = ppVar23->second;
      ppVar23->second = iVar26;
      ppVar19 = ppVar19 + 1;
      ppVar23 = ppVar23 + -1;
    } while (ppVar19 < ppVar23);
  }
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_c0[0] != (pointer)0x0) {
    operator_delete((void *)local_c0[0],local_c0[2] - local_c0[0],0x20);
  }
  return (Alignment *)local_120;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}